

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void CheckFile(string *name,string *expected_string)

{
  FILE *__stream;
  char *pcVar1;
  ostream *poVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  CheckOpString _result;
  char buf [1000];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  LogMessage local_420;
  unsigned_long local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408 [31];
  
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(local_408,name,"*");
  GetFiles(local_408,&local_438);
  std::__cxx11::string::~string((string *)local_408);
  local_408[0]._M_dataplus._M_p =
       (pointer)((long)local_438.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_438.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_410 = 1;
  local_420.allocated_ =
       (LogMessageData *)
       google::Check_EQImpl<unsigned_long,unsigned_long>
                 ((unsigned_long *)local_408,&local_410,"files.size() == 1UL");
  if (local_420.allocated_ == (LogMessageData *)0x0) {
    __stream = fopen(((local_438.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,"r");
    if (__stream != (FILE *)0x0) {
      do {
        pcVar1 = fgets((char *)local_408,1000,__stream);
        if (pcVar1 == (char *)0x0) {
          fclose(__stream);
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_420,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                     ,0x2ac);
          poVar2 = google::LogMessage::stream(&local_420);
          poVar2 = std::operator<<(poVar2,"Did not find ");
          poVar2 = std::operator<<(poVar2,(string *)expected_string);
          poVar2 = std::operator<<(poVar2," in ");
          std::operator<<(poVar2,(string *)
                                 local_438.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_420);
        }
        pcVar1 = strstr((char *)local_408,(expected_string->_M_dataplus)._M_p);
      } while (pcVar1 == (char *)0x0);
      fclose(__stream);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_438);
      return;
    }
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_408,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
               ,0x2a3);
    poVar2 = google::LogMessage::stream((LogMessage *)local_408);
    poVar2 = std::operator<<(poVar2,"Check failed: file != NULL ");
    poVar2 = std::operator<<(poVar2,": could not open ");
    std::operator<<(poVar2,(string *)
                           local_438.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_408,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
               ,0x2a0,(CheckOpString *)&local_420);
    google::LogMessage::stream((LogMessage *)local_408);
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_408);
}

Assistant:

static void CheckFile(const string& name, const string& expected_string) {
  vector<string> files;
  GetFiles(name + "*", &files);
  CHECK_EQ(files.size(), 1UL);

  FILE* file = fopen(files[0].c_str(), "r");
  CHECK(file != NULL) << ": could not open " << files[0];
  char buf[1000];
  while (fgets(buf, sizeof(buf), file) != NULL) {
    if (strstr(buf, expected_string.c_str()) != NULL) {
      fclose(file);
      return;
    }
  }
  fclose(file);
  LOG(FATAL) << "Did not find " << expected_string << " in " << files[0];
}